

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstrmatrixor.cpp
# Opt level: O0

void __thiscall
TPZStructMatrixOR<std::complex<double>_>::Assemble
          (TPZStructMatrixOR<std::complex<double>_> *this,TPZBaseMatrix *stiffness,
          TPZBaseMatrix *rhs,TPZAutoPointer<TPZGuiInterface> *guiInterface)

{
  bool bVar1;
  TPZStructMatrix *this_00;
  TPZBaseMatrix *in_RCX;
  RunStatsTable *in_RDX;
  TPZAutoPointer<TPZGuiInterface> *in_RSI;
  TPZFMatrix<std::complex<double>_> *in_RDI;
  TPZFMatrix<std::complex<double>_> rhsloc;
  int64_t neqcondense;
  TPZEquationFilter *equationFilter;
  TPZEquationFilter *in_stack_fffffffffffffe98;
  RunStatsTable *in_stack_fffffffffffffea0;
  TPZFMatrix<std::complex<double>_> *in_stack_fffffffffffffed0;
  TPZEquationFilter *in_stack_ffffffffffffff10;
  undefined1 local_e8 [8];
  undefined1 local_e0 [8];
  undefined1 local_d8 [24];
  undefined1 local_c0 [144];
  int64_t local_30;
  TPZEquationFilter *local_28;
  RunStatsTable *local_18;
  TPZAutoPointer<TPZGuiInterface> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (in_RDI == (TPZFMatrix<std::complex<double>_> *)0x0) {
    this_00 = (TPZStructMatrix *)0x0;
  }
  else {
    this_00 = (TPZStructMatrix *)
              __dynamic_cast(in_RDI,&TPZStructMatrixOR<std::complex<double>>::typeinfo,
                             &::TPZStructMatrix::typeinfo,0xfffffffffffffffe);
  }
  local_28 = ::TPZStructMatrix::EquationFilter(this_00);
  RunStatsTable::start(in_stack_fffffffffffffea0);
  bVar1 = TPZEquationFilter::IsActive(local_28);
  if (bVar1) {
    local_30 = TPZEquationFilter::NActiveEquations(in_stack_fffffffffffffe98);
    TPZFMatrix<std::complex<double>_>::TPZFMatrix(in_stack_fffffffffffffed0);
    bVar1 = TPZStrMatParInterface::ComputeRhs
                      ((TPZStrMatParInterface *)
                       ((in_RDI->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.
                        super_TPZSavable._vptr_TPZSavable[-0xc] + -0x38 +
                       (long)((((TPZFMatrix<std::complex<double>_> *)(&in_RDI->fPivot + -1))->fPivot
                              ).fExtAlloc + -8)));
    if (bVar1) {
      TPZBaseMatrix::Cols((TPZBaseMatrix *)local_18);
      TPZFMatrix<std::complex<double>_>::Redim(in_RDI,(int64_t)in_RCX,(int64_t)this_00);
    }
    if (*(int *)((long)(in_RDI->fPivot).fExtAlloc +
                (long)((in_RDI->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.
                       super_TPZSavable._vptr_TPZSavable[-0xc] + -0x50)) == 0) {
      TPZAutoPointer<TPZGuiInterface>::TPZAutoPointer
                ((TPZAutoPointer<TPZGuiInterface> *)in_stack_fffffffffffffea0,
                 (TPZAutoPointer<TPZGuiInterface> *)in_stack_fffffffffffffe98);
      (*(in_RDI->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable[0xb])(in_RDI,local_10,local_c0,local_e0);
      TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer
                ((TPZAutoPointer<TPZGuiInterface> *)in_stack_fffffffffffffea0);
    }
    else {
      TPZAutoPointer<TPZGuiInterface>::TPZAutoPointer
                ((TPZAutoPointer<TPZGuiInterface> *)in_stack_fffffffffffffea0,
                 (TPZAutoPointer<TPZGuiInterface> *)in_stack_fffffffffffffe98);
      (*(in_RDI->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable[0xe])(in_RDI,local_10,local_c0,local_d8);
      TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer
                ((TPZAutoPointer<TPZGuiInterface> *)in_stack_fffffffffffffea0);
    }
    bVar1 = TPZStrMatParInterface::ComputeRhs
                      ((TPZStrMatParInterface *)
                       ((in_RDI->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.
                        super_TPZSavable._vptr_TPZSavable[-0xc] + -0x38 +
                       (long)((((TPZFMatrix<std::complex<double>_> *)(&in_RDI->fPivot + -1))->fPivot
                              ).fExtAlloc + -8)));
    if (bVar1) {
      TPZEquationFilter::Scatter(in_stack_ffffffffffffff10,(TPZBaseMatrix *)in_RDI,in_RCX);
    }
    TPZFMatrix<std::complex<double>_>::~TPZFMatrix((TPZFMatrix<std::complex<double>_> *)0x1d76138);
    local_18 = in_stack_fffffffffffffea0;
  }
  else if (*(int *)((long)(in_RDI->fPivot).fExtAlloc +
                   (long)((in_RDI->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.
                          super_TPZSavable._vptr_TPZSavable[-0xc] + -0x50)) == 0) {
    TPZAutoPointer<TPZGuiInterface>::TPZAutoPointer
              ((TPZAutoPointer<TPZGuiInterface> *)local_18,local_10);
    (*(in_RDI->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0xb])(in_RDI,local_10,local_18,&stack0xffffffffffffff10);
    TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer((TPZAutoPointer<TPZGuiInterface> *)local_18);
  }
  else {
    TPZAutoPointer<TPZGuiInterface>::TPZAutoPointer
              ((TPZAutoPointer<TPZGuiInterface> *)in_stack_fffffffffffffea0,
               (TPZAutoPointer<TPZGuiInterface> *)in_stack_fffffffffffffe98);
    (*(in_RDI->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0xe])(in_RDI,local_10,local_18,local_e8);
    TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer
              ((TPZAutoPointer<TPZGuiInterface> *)in_stack_fffffffffffffea0);
    local_18 = in_stack_fffffffffffffea0;
  }
  RunStatsTable::stop(local_18);
  return;
}

Assistant:

void 
TPZStructMatrixOR<TVar>::Assemble(TPZBaseMatrix & stiffness, TPZBaseMatrix & rhs, TPZAutoPointer<TPZGuiInterface> guiInterface) {
    const auto &equationFilter =
        (dynamic_cast<TPZStructMatrix*>(this))->EquationFilter();
    ass_stiff.start();
    if (equationFilter.IsActive()) {
        int64_t neqcondense = equationFilter.NActiveEquations();
#ifdef PZDEBUG
        if (stiffness.Rows() != neqcondense) {
            DebugStop();
        }
#endif
        TPZFMatrix<TVar> rhsloc;
        if(ComputeRhs()) rhsloc.Redim(neqcondense, rhs.Cols());
        if (this->fNumThreads) {
            this->MultiThread_Assemble(stiffness, rhsloc, guiInterface);
        } else {
            this->Serial_Assemble(stiffness, rhsloc, guiInterface);
        }

        if(ComputeRhs()) equationFilter.Scatter(rhsloc, rhs);
    } else {
        if (this->fNumThreads) {
            this->MultiThread_Assemble(stiffness, rhs, guiInterface);
        } else {
            this->Serial_Assemble(stiffness, rhs, guiInterface);
        }
    }
    ass_stiff.stop();
}